

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::Value,_true> *ret)

{
  int iVar1;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  long lVar2;
  Value val;
  pointer local_88;
  pointer pVStack_80;
  pointer local_78;
  pointer local_68;
  pointer pVStack_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  local_88 = (pointer)0x0;
  pVStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      Value::Deserialize((Value *)&local_68,this);
      (*this->_vptr_Deserializer[7])(this);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88,
                 (Value *)&local_68);
      Value::~Value((Value *)&local_68);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  local_58._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_78;
  local_68 = (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  pVStack_60 = (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
  (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88;
  (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_80;
  local_88 = (pointer)0x0;
  pVStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88);
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}